

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_compact_surf_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_MPI pRVar4;
  REF_CELL ref_cell;
  REF_STATUS RVar5;
  uint uVar6;
  uint uVar7;
  REF_GLOB *pRVar8;
  void *array;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uVar12;
  int cell;
  char *pcVar13;
  REF_CELL *ppRVar14;
  int iVar15;
  long lVar16;
  int local_e0;
  REF_INT nnode;
  REF_MPI local_d8;
  REF_INT local_d0;
  REF_INT part;
  long *local_c8;
  long *local_c0;
  REF_CELL *local_b8;
  long local_b0;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  lVar16 = (long)ref_node->max;
  local_d0 = cell_id;
  local_c8 = ncell_global;
  if (lVar16 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25f,
           "ref_grid_compact_surf_id_nodes","malloc *l2c of REF_GLOB negative");
    uVar6 = 1;
  }
  else {
    pRVar4 = ref_grid->mpi;
    pRVar8 = (REF_GLOB *)malloc(lVar16 * 8);
    *l2c = pRVar8;
    if (pRVar8 == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25f,
             "ref_grid_compact_surf_id_nodes","malloc *l2c of REF_GLOB NULL");
      uVar6 = 2;
    }
    else {
      for (lVar10 = 0; lVar16 != lVar10; lVar10 = lVar10 + 1) {
        pRVar8[lVar10] = -1;
      }
      *nnode_global = 0;
      *local_c8 = 0;
      nnode = 0;
      local_b8 = ref_grid->cell;
      ppRVar14 = ref_grid->cell + 3;
      iVar15 = 0;
      local_e0 = 0;
      lVar16 = 3;
      local_d8 = pRVar4;
      local_c0 = nnode_global;
      while (pRVar4 = local_d8, lVar16 != 8) {
        ref_cell = *ppRVar14;
        local_b0 = lVar16;
        for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
          RVar5 = ref_cell_nodes(ref_cell,cell,nodes);
          if ((RVar5 == 0) && (nodes[ref_cell->node_per] == local_d0)) {
            uVar6 = ref_cell_part(ref_cell,ref_node,cell,&part);
            if (uVar6 != 0) {
              pcVar13 = "part";
              uVar12 = 0x269;
              goto LAB_0012495b;
            }
            iVar1 = local_d8->id;
            iVar2 = ref_cell->node_per;
            for (lVar16 = 0; lVar16 < iVar2; lVar16 = lVar16 + 1) {
              iVar3 = nodes[lVar16];
              if ((ref_node->ref_mpi->id == ref_node->part[iVar3]) && ((*l2c)[iVar3] == -1)) {
                (*l2c)[iVar3] = (long)iVar15;
                iVar15 = iVar15 + 1;
                nnode = iVar15;
              }
            }
            local_e0 = local_e0 + (uint)(iVar1 == part);
          }
        }
        ppRVar14 = local_b8 + local_b0 + 1;
        lVar16 = local_b0 + 1;
      }
      *local_c8 = (long)local_e0;
      uVar6 = 1;
      uVar7 = ref_mpi_allsum(local_d8,local_c8,1,2);
      if (uVar7 == 0) {
        if ((long)pRVar4->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x27b,"ref_grid_compact_surf_id_nodes","malloc counts of REF_INT negative");
        }
        else {
          array = malloc((long)pRVar4->n << 2);
          pRVar4 = local_d8;
          if (array == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x27b,"ref_grid_compact_surf_id_nodes","malloc counts of REF_INT NULL");
            uVar6 = 2;
          }
          else {
            uVar6 = ref_mpi_allgather(local_d8,&nnode,array,1);
            if (uVar6 == 0) {
              uVar11 = 0;
              uVar9 = (ulong)(uint)pRVar4->id;
              if (pRVar4->id < 1) {
                uVar9 = uVar11;
              }
              iVar15 = 0;
              for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
                iVar15 = iVar15 + *(int *)((long)array + uVar11 * 4);
              }
              uVar11 = 0;
              uVar9 = (ulong)(uint)local_d8->n;
              if (local_d8->n < 1) {
                uVar9 = uVar11;
              }
              for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
                *local_c0 = *local_c0 + (long)*(int *)((long)array + uVar11 * 4);
              }
              free(array);
              uVar11 = 0;
              uVar9 = (ulong)(uint)ref_node->max;
              if (ref_node->max < 1) {
                uVar9 = uVar11;
              }
              pRVar8 = *l2c;
              for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
                if (pRVar8[uVar11] != -1) {
                  pRVar8[uVar11] = pRVar8[uVar11] + (long)iVar15;
                }
              }
              uVar6 = ref_node_ghost_glob(ref_node,pRVar8,1);
              if (uVar6 == 0) {
                return 0;
              }
              pcVar13 = "xfer";
              uVar12 = 0x28a;
            }
            else {
              pcVar13 = "gather size";
              uVar12 = 0x27c;
            }
LAB_0012495b:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   uVar12,"ref_grid_compact_surf_id_nodes",(ulong)uVar6,pcVar13);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x279,"ref_grid_compact_surf_id_nodes",(ulong)uVar7,"allsum");
        uVar6 = uVar7;
      }
    }
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_surf_id_nodes(REF_GRID ref_grid,
                                                  REF_INT cell_id,
                                                  REF_GLOB *nnode_global,
                                                  REF_LONG *ncell_global,
                                                  REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset, group;
  REF_CELL ref_cell;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_grid_2d_ref_cell(ref_grid, group,
                            ref_cell){each_ref_cell_valid_cell_with_nodes(
      ref_cell, cell, nodes){if (cell_id == nodes[ref_cell_id_index(ref_cell)]){
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
  if (ref_mpi_rank(ref_mpi) == part) {
    ncell++;
  }
  each_ref_cell_cell_node(ref_cell, cell_node) {
    if (ref_node_owned(ref_node, nodes[cell_node]) &&
        (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
      (*l2c)[nodes[cell_node]] = nnode;
      nnode++;
    }
  }
}
}
}

(*ncell_global) = ncell;
RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
offset = 0;
for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
  offset += counts[proc];
}
each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }